

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmetrohash64.c
# Opt level: O3

void cmetrohash64_2(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 *puVar3;
  undefined1 *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint8_t *puVar7;
  undefined1 (*pauVar8) [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar5 = len + 0x52bc33fedbe4cbb5 + (ulong)seed * 0xd6d018f5;
  pauVar8 = (undefined1 (*) [16])key;
  if (0x1f < len) {
    auVar2 = vpmovzxdq_avx(ZEXT816(0xa2aa033bd6d018f5));
    auVar1 = vpmovsxdq_avx(ZEXT816(0x30bc5b2962992fc1));
    auVar13 = vpbroadcastq_avx512vl();
    auVar16 = auVar13;
    do {
      auVar14 = vpmullq_avx512vl(auVar2,*pauVar8);
      auVar15 = vpmullq_avx512vl(auVar1,pauVar8[1]);
      pauVar8 = pauVar8 + 2;
      auVar16 = vpaddq_avx(auVar14,auVar16);
      auVar16 = vprolq_avx512vl(auVar16,0x23);
      auVar16 = vpaddq_avx(auVar16,auVar13);
      auVar13 = vpaddq_avx(auVar15,auVar13);
      auVar13 = vprolq_avx512vl(auVar13,0x23);
      auVar13 = vpaddq_avx(auVar13,auVar16);
    } while (pauVar8 <= (undefined1 (*) [16])(key + (len - 0x20)));
    uVar10 = vpextrq_avx(auVar13,1);
    uVar11 = auVar16._0_8_;
    uVar9 = vpextrq_avx(auVar16,1);
    uVar6 = (uVar10 + uVar11) * 0xd6d018f5 + uVar9;
    uVar12 = auVar13._0_8_ ^ (uVar6 >> 0x1e | uVar6 << 0x22) * 0xa2aa033b;
    uVar6 = (uVar12 + uVar9) * 0xa2aa033b + uVar11;
    uVar10 = (uVar6 >> 0x1e | uVar6 << 0x22) * 0xd6d018f5 ^ uVar10;
    uVar6 = (uVar12 + uVar11) * 0xd6d018f5 + uVar10;
    uVar12 = (uVar10 + uVar9) * 0xa2aa033b + uVar12;
    uVar5 = uVar5 + ((uVar6 >> 0x1e | uVar6 << 0x22) * 0xa2aa033b ^ uVar11 ^ uVar9 ^
                    (uVar12 >> 0x1e | uVar12 << 0x22) * 0xd6d018f5);
  }
  puVar7 = key + (len - (long)pauVar8);
  if (0xf < (long)puVar7) {
    puVar3 = *pauVar8;
    puVar4 = *pauVar8;
    pauVar8 = pauVar8 + 1;
    uVar10 = *(long *)puVar3 * 0x62992fc1 + uVar5;
    uVar12 = *(long *)(puVar4 + 8) * 0x62992fc1 + uVar5;
    uVar6 = uVar10 >> 0x1d;
    uVar9 = uVar6 | uVar10 << 0x23;
    uVar10 = uVar12 >> 0x1d;
    uVar11 = uVar10 | uVar12 << 0x23;
    uVar12 = uVar11 * 0x30bc5b29;
    puVar7 = key + (len - (long)pauVar8);
    uVar5 = uVar5 + ((uVar10 * 0x592b8b2440000000 | uVar11 * 0x9472cc564ae2c91 >> 0x22) +
                     ((uVar6 * -0x56f83a70c0000000 | uVar9 * 0x28e511fea41f163d >> 0x22) + uVar12 ^
                     uVar9 * 0x30bc5b29) ^ uVar12);
  }
  if (7 < (long)puVar7) {
    puVar3 = *pauVar8;
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + 8);
    uVar5 = *(long *)puVar3 * 0x30bc5b29 + uVar5;
    uVar5 = (uVar5 >> 0x24 | uVar5 * 0x10000000) * 0xa2aa033b ^ uVar5;
    puVar7 = key + (len - (long)pauVar8);
  }
  if (3 < (long)puVar7) {
    puVar3 = *pauVar8;
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + 4);
    uVar5 = (ulong)*(uint *)puVar3 * 0x30bc5b29 + uVar5;
    uVar5 = (uVar5 >> 0xf | uVar5 << 0x31) * 0xa2aa033b ^ uVar5;
    puVar7 = key + (len - (long)pauVar8);
  }
  if (1 < (long)puVar7) {
    puVar3 = *pauVar8;
    pauVar8 = (undefined1 (*) [16])(*pauVar8 + 2);
    puVar7 = key + (len - (long)pauVar8);
    uVar5 = (ulong)*(ushort *)puVar3 * 0x30bc5b29 + uVar5;
    uVar5 = (uVar5 >> 0xf | uVar5 << 0x31) * 0xa2aa033b ^ uVar5;
  }
  if (0 < (long)puVar7) {
    uVar5 = (ulong)(byte)(*pauVar8)[0] * 0x30bc5b29 + uVar5;
    uVar5 = (uVar5 >> 0x17 | uVar5 << 0x29) * 0xa2aa033b ^ uVar5;
  }
  uVar5 = (uVar5 >> 0x1c | uVar5 << 0x24) ^ uVar5;
  uVar6 = uVar5 * 0xd6d018f5;
  *(ulong *)out = (uVar5 * -0x497f385800000000 | uVar6 >> 0x1d) ^ uVar6;
  return;
}

Assistant:

void cmetrohash64_2(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xD6D018F5;
    static const uint64_t k1 = 0xA2AA033B;
    static const uint64_t k2 = 0x62992FC1;
    static const uint64_t k3 = 0x30BC5B29; 

    const uint8_t * ptr = key;
    const uint8_t * const end = ptr + len;
    
    uint64_t hash = ((((uint64_t) seed) + k2) * k0) + len;
    
    if (len >= 32)
    {
        uint64_t v[4];
        v[0] = hash;
        v[1] = hash;
        v[2] = hash;
        v[3] = hash;
        
        do
        {
            v[0] += cread_u64(ptr) * k0; ptr += 8; v[0] = crotate_right(v[0],29) + v[2];
            v[1] += cread_u64(ptr) * k1; ptr += 8; v[1] = crotate_right(v[1],29) + v[3];
            v[2] += cread_u64(ptr) * k2; ptr += 8; v[2] = crotate_right(v[2],29) + v[0];
            v[3] += cread_u64(ptr) * k3; ptr += 8; v[3] = crotate_right(v[3],29) + v[1];
        }
        while (ptr <= (end - 32));

        v[2] ^= crotate_right(((v[0] + v[3]) * k0) + v[1], 30) * k1;
        v[3] ^= crotate_right(((v[1] + v[2]) * k1) + v[0], 30) * k0;
        v[0] ^= crotate_right(((v[0] + v[2]) * k0) + v[3], 30) * k1;
        v[1] ^= crotate_right(((v[1] + v[3]) * k1) + v[2], 30) * k0;
        hash += v[0] ^ v[1];
    }
    
    if ((end - ptr) >= 16)
    {
        uint64_t v0 = hash + (cread_u64(ptr) * k2); ptr += 8; v0 = crotate_right(v0,29) * k3;
        uint64_t v1 = hash + (cread_u64(ptr) * k2); ptr += 8; v1 = crotate_right(v1,29) * k3;
        v0 ^= crotate_right(v0 * k0, 34) + v1;
        v1 ^= crotate_right(v1 * k3, 34) + v0;
        hash += v1;
    }
    
    if ((end - ptr) >= 8)
    {
        hash += cread_u64(ptr) * k3; ptr += 8;
        hash ^= crotate_right(hash, 36) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        hash += cread_u32(ptr) * k3; ptr += 4;
        hash ^= crotate_right(hash, 15) * k1;
    }
    
    if ((end - ptr) >= 2)
    {
        hash += cread_u16(ptr) * k3; ptr += 2;
        hash ^= crotate_right(hash, 15) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        hash += cread_u8 (ptr) * k3;
        hash ^= crotate_right(hash, 23) * k1;
    }
    
    hash ^= crotate_right(hash, 28);
    hash *= k0;
    hash ^= crotate_right(hash, 29);

    memcpy(out, &hash, 8);
}